

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneDiffer.cpp
# Opt level: O2

string * __thiscall
Assimp::dumpVector3_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,aiVector3D *toDump)

{
  ostream *poVar1;
  stringstream stream;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"( ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)this);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 4));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(this + 8));
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string dumpVector3( const aiVector3D &toDump ) {
    std::stringstream stream;
    stream << "( " << toDump.x << ", " << toDump.y << ", " << toDump.z << ")";
    return stream.str();
}